

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O3

void Acec_ManDerive_rec(Gia_Man_t *pNew,Gia_Man_t *p,int Node,Vec_Int_t *vMirrors)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  
  if ((-1 < Node) && (Node < vMirrors->nSize)) {
    uVar14 = (uint)vMirrors->pArray[(uint)Node] >> 1;
    if (vMirrors->pArray[(uint)Node] < 0) {
      uVar14 = Node;
    }
    if (p->nObjs <= (int)uVar14) {
LAB_00660d44:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar5 = p->pObjs[uVar14].Value;
    if (uVar5 == 0xffffffff) {
      pGVar1 = p->pObjs + uVar14;
      uVar5 = (uint)*(ulong *)pGVar1;
      if (((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                      ,0x39,"void Acec_ManDerive_rec(Gia_Man_t *, Gia_Man_t *, int, Vec_Int_t *)");
      }
      Acec_ManDerive_rec(pNew,p,uVar14 - (uVar5 & 0x1fffffff),vMirrors);
      Acec_ManDerive_rec(pNew,p,uVar14 - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff),vMirrors);
      uVar12 = *(ulong *)pGVar1;
      uVar6 = uVar12 & 0x1fffffff;
      uVar5 = (uint)(uVar12 >> 0x20);
      if ((uVar6 == 0x1fffffff || (int)(uint)uVar12 < 0) ||
         ((uVar5 & 0x1fffffff) <= ((uint)uVar12 & 0x1fffffff))) {
        if (((int)pGVar1[-uVar6].Value < 0) || ((int)pGVar1[-(ulong)(uVar5 & 0x1fffffff)].Value < 0)
           ) goto LAB_00660d63;
        uVar5 = Gia_ManAppendAnd(pNew,pGVar1[-uVar6].Value ^ (uint)(uVar12 >> 0x1d) & 1,
                                 pGVar1[-(ulong)(uVar5 & 0x1fffffff)].Value ^ uVar5 >> 0x1d & 1);
      }
      else {
        uVar10 = pGVar1[-uVar6].Value;
        if (((int)uVar10 < 0) ||
           (uVar11 = pGVar1[-(ulong)(uVar5 & 0x1fffffff)].Value, (int)uVar11 < 0))
        goto LAB_00660d63;
        pGVar7 = Gia_ManAppendObj(pNew);
        uVar9 = uVar10 >> 1;
        uVar2 = pNew->nObjs;
        if ((int)uVar2 <= (int)uVar9) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x2d4,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
        }
        uVar8 = uVar11 >> 1;
        if (uVar2 <= uVar8) {
          __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x2d5,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
        }
        if (uVar9 == uVar8) {
          __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x2d6,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
        }
        uVar10 = uVar10 ^ (uint)(uVar12 >> 0x1d) & 7;
        uVar11 = uVar11 ^ uVar5 >> 0x1d;
        pGVar3 = pNew->pObjs;
        iVar4 = (int)pGVar7;
        if (uVar8 < uVar9) {
          if (pGVar3 + uVar2 <= pGVar7 || pGVar7 < pGVar3) goto LAB_00660da1;
          uVar12 = *(ulong *)pGVar7;
          uVar6 = (ulong)((uVar10 & 1) << 0x1d |
                         ((uint)(iVar4 - (int)pGVar3) >> 2) * -0x55555555 - uVar9 & 0x1fffffff);
          *(ulong *)pGVar7 = uVar6 | uVar12 & 0xffffffffc0000000;
          pGVar3 = pNew->pObjs;
          if ((pGVar7 < pGVar3) || (pGVar3 + pNew->nObjs <= pGVar7)) goto LAB_00660da1;
          uVar12 = (ulong)(uVar11 & 1) << 0x3d |
                   uVar6 | uVar12 & 0xc0000000c0000000 |
                   (ulong)(((uint)(iVar4 - (int)pGVar3) >> 2) * -0x55555555 - uVar8 & 0x1fffffff) <<
                   0x20;
        }
        else {
          if (pGVar3 + uVar2 <= pGVar7 || pGVar7 < pGVar3) goto LAB_00660da1;
          uVar12 = *(ulong *)pGVar7;
          uVar13 = (ulong)(((uint)(iVar4 - (int)pGVar3) >> 2) * -0x55555555 - uVar9 & 0x1fffffff) <<
                   0x20;
          uVar6 = (ulong)(uVar10 & 1) << 0x3d;
          *(ulong *)pGVar7 = uVar6 | uVar12 & 0xc0000000ffffffff | uVar13;
          pGVar3 = pNew->pObjs;
          if ((pGVar7 < pGVar3) || (pGVar3 + pNew->nObjs <= pGVar7)) goto LAB_00660da1;
          uVar12 = (ulong)((uVar11 & 1) << 0x1d) | uVar6 | uVar12 & 0xc0000000c0000000 | uVar13 |
                   (ulong)(((uint)(iVar4 - (int)pGVar3) >> 2) * -0x55555555 - uVar8 & 0x1fffffff);
        }
        *(ulong *)pGVar7 = uVar12;
        pNew->nXors = pNew->nXors + 1;
        pGVar3 = pNew->pObjs;
        if ((pGVar7 < pGVar3) || (pGVar3 + pNew->nObjs <= pGVar7)) {
LAB_00660da1:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar5 = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * 0x55555556;
      }
      pGVar1->Value = uVar5;
    }
    if (uVar14 != Node) {
      if (vMirrors->nSize <= Node) goto LAB_00660d25;
      if (vMirrors->pArray[(uint)Node] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      if ((int)uVar5 < 0) {
LAB_00660d63:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      if (p->nObjs <= Node) goto LAB_00660d44;
      p->pObjs[(uint)Node].Value = vMirrors->pArray[(uint)Node] & 1U ^ uVar5;
    }
    return;
  }
LAB_00660d25:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////



////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Acec_ManDerive_rec( Gia_Man_t * pNew, Gia_Man_t * p, int Node, Vec_Int_t * vMirrors )
{
    Gia_Obj_t * pObj;
    int Obj = Node;
    if ( Vec_IntEntry(vMirrors, Node) >= 0 )
        Obj = Abc_Lit2Var( Vec_IntEntry(vMirrors, Node) );
    pObj = Gia_ManObj( p, Obj );
    if ( !~pObj->Value )
    {
        assert( Gia_ObjIsAnd(pObj) );
        Acec_ManDerive_rec( pNew, p, Gia_ObjFaninId0(pObj, Obj), vMirrors );
        Acec_ManDerive_rec( pNew, p, Gia_ObjFaninId1(pObj, Obj), vMirrors );
        if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManAppendXorReal( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    // set the original node as well
    if ( Obj != Node )
        Gia_ManObj(p, Node)->Value = Abc_LitNotCond( pObj->Value, Abc_LitIsCompl(Vec_IntEntry(vMirrors, Node)) );
}